

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O3

void __thiscall Poll::loop(Poll *this)

{
  size_type sVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  const_iterator __position;
  int iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  _Base_ptr p_Var6;
  pointer ppVar7;
  iterator iVar8;
  Error *this_01;
  nfds_t __nfds;
  ulong uVar9;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Alarm>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>>
  *this_02;
  _Self __tmp;
  value_type fd;
  pollfd local_48;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Alarm>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>>
  *local_40;
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Subscriber>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  uVar4 = current_time_millis();
  if (this->shutdown == false) {
    local_38 = &(this->subs)._M_h;
    this_02 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Alarm>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>>
               *)&this->alarms;
    local_40 = this_02;
    do {
      sVar1 = (this->subs)._M_h._M_element_count;
      if (sVar1 == 0) {
        return;
      }
      ppVar7 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start;
      __nfds = (long)(this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppVar7 >> 3;
      if (sVar1 * 3 < __nfds) {
        compact(this);
        ppVar7 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __nfds = (long)(this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppVar7 >> 3;
      }
      iVar3 = poll((pollfd *)ppVar7,__nfds,100);
      iVar3 = no_err(iVar3,"error in poll");
      if ((iVar3 == 0) || (uVar5 = current_time_millis(), 100 < uVar5 - uVar4)) {
        uVar4 = current_time_millis();
        __position._M_node = (this->alarms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (((_Rb_tree_header *)__position._M_node !=
                &(this->alarms)._M_t._M_impl.super__Rb_tree_header &&
               (*(ulong *)(__position._M_node + 1) <= uVar4))) {
          Alarm::on_timeout((Alarm *)__position._M_node[1]._M_parent);
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Alarm>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>>
          ::erase_abi_cxx11_(this_02,__position);
          __position._M_node = p_Var6;
        }
      }
      else {
        ppVar7 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
            super__Vector_impl_data._M_finish != ppVar7) {
          uVar9 = 0;
          do {
            local_48 = ppVar7[uVar9];
            if ((ulong)local_48 >> 0x30 != 0) {
              iVar8 = std::
                      _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Subscriber>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(local_38,&local_48.fd);
              if (iVar8.
                  super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                this_01 = (Error *)__cxa_allocate_exception(0x3f0);
                Error::Error(this_01,"No handler for fd %d",(ulong)local_48 & 0xffffffff);
                __cxa_throw(this_01,&Error::typeinfo,std::exception::~exception);
              }
              plVar2 = *(long **)((long)iVar8.
                                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>
                                        ._M_cur + 0x10);
              this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)iVar8.
                                super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>
                                ._M_cur + 0x18);
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
              if (((ulong)local_48 & 0x1000000000000) != 0) {
                (**(code **)(*plVar2 + 8))(plVar2,this);
              }
              if ((local_48.revents & 4U) != 0) {
                (**(code **)(*plVar2 + 0x10))(plVar2,this);
              }
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
            }
            uVar9 = uVar9 + 1;
            ppVar7 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_start;
            this_02 = local_40;
          } while (uVar9 < (ulong)((long)(this->fds).
                                         super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)ppVar7 >> 3));
        }
      }
    } while (this->shutdown != true);
  }
  return;
}

Assistant:

void Poll::loop() {
  uint64_t time = current_time_millis();
  while (!this->shutdown && this->subs.size() > 0) {
    if (this->fds.size() > COMPACTION_THRESHOLD * this->subs.size())
      compact();
    int changed_fds = no_err(poll(&fds[0], fds.size(), WAIT_QUANTUM), "error in poll");
    if (changed_fds == 0 || current_time_millis() - time > WAIT_QUANTUM) { //Timeout occured
      time = current_time_millis();
      for (auto it = alarms.cbegin(); it != alarms.cend() && it->first <= time;) {
        it->second->on_timeout();
        alarms.erase(it++);
      }
      continue;
    }
    for (int i = 0; i < fds.size(); ++i) {
      auto fd = fds[i];
      if (fd.revents == 0) continue;
      auto listener_itr = this->subs.find(fd.fd);
      if (listener_itr == this->subs.end()) {
        throw Error("No handler for fd %d", fd.fd);
      }
      std::shared_ptr<Subscriber> listener = listener_itr->second;
      try {
        if (fd.revents & POLLIN) {
          listener->on_input(*this);
        }
        if (fd.revents & POLLOUT) {
          listener->on_output(*this);
        }
        if (fd.revents & !(POLLIN | POLLOUT)) {
          std::cout << "Error event from poll " << fd.revents << std::endl;
          listener->on_error(*this, fd.revents);
        }
      } catch (Error &e) {
        printf("Error in event loop %s listener=%s pollfd{ev=%d, fd=%d, revents=%d}\n",
               e.what(), &listener->get_name()[0], fd.events, fd.fd, fd.revents);
      }
    }
  }
}